

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v_basic.c
# Opt level: O0

_Bool test_clear(void)

{
  int n_row;
  long lVar1;
  uint8_t *memory;
  int iVar2;
  undefined8 uStack_a0;
  uint8_t auStack_98 [4];
  int iStack_94;
  uint8_t *local_90;
  uint local_84;
  undefined1 local_80 [8];
  m256v A;
  unsigned_long __vla_expr0;
  uint local_54;
  int nc;
  int ic;
  int nr;
  int ir;
  int ncol [6];
  int local_28 [2];
  int nrow [6];
  
  nrow[0] = 3;
  nrow[1] = 5;
  nrow[2] = 9;
  nrow[3] = 10;
  _nr = 0x200000001;
  ncol[0] = 3;
  ncol[1] = 7;
  ncol[2] = 8;
  ncol[3] = 10;
  for (ic = 0; (uint)ic < 6; ic = ic + 1) {
    n_row = nrow[(long)ic + -2];
    for (local_54 = 0; local_54 < 6; local_54 = local_54 + 1) {
      iVar2 = (&nr)[(int)local_54];
      A.e = (uint8_t *)(ulong)(uint)(n_row * iVar2);
      lVar1 = -((ulong)(A.e + 0xf) & 0xfffffffffffffff0);
      local_90 = auStack_98 + lVar1;
      *(undefined8 *)((long)&uStack_a0 + lVar1) = 0x101f6c;
      rand_coeffs(*(uint8_t **)((long)&local_90 + lVar1),*(int *)(auStack_98 + lVar1 + 4),
                  auStack_98[lVar1 + 3]);
      memory = local_90;
      *(undefined8 *)((long)&uStack_a0 + lVar1) = 0x101f82;
      m256v_make((m256v *)local_80,n_row,iVar2,memory);
      *(undefined8 *)((long)&uStack_a0 + lVar1) = 0x101f8b;
      m256v_clear(*(m256v **)((long)&local_90 + lVar1));
      *(undefined8 *)((long)&uStack_a0 + lVar1) = 0x101f94;
      iVar2 = m256v_iszero(*(m256v **)(auStack_98 + lVar1));
      if (iVar2 != 0) {
        local_84 = 0;
      }
      else {
        nrow[5]._3_1_ = 0;
        local_84 = 1;
      }
      local_84 = (uint)(iVar2 == 0);
      if (local_84 != 0) goto LAB_00101fe3;
    }
  }
  nrow[5]._3_1_ = 1;
LAB_00101fe3:
  return (_Bool)(nrow[5]._3_1_ & 1);
}

Assistant:

static bool test_clear()
{
	const int nrow[] = { 1, 2, 3, 5, 9, 10 };
	const int ncol[] = { 1, 2, 3, 7, 8, 10 };
	for (int ir = 0; ir < array_size(nrow); ++ir) {
		const int nr = nrow[ir];
		for (int ic = 0; ic < array_size(ncol); ++ic) {
			const int nc = ncol[ic];

			/* Create a random matrix, clear it, and verify
			 * it's cleared
			 */
			Def_mat256_rand(A, a, nr, nc, 0xff)
			m256v_clear(&A);
			if (!m256v_iszero(&A))
				return false;
		}
	}

	return true;
}